

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O3

int64_t __thiscall
disruptor::BusySpinStrategy::WaitFor<long,std::ratio<1l,1000000l>>
          (BusySpinStrategy *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1000000L>_> *timeout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  function<long_()> min_sequence;
  Sequence *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar1 = timeout->__r;
  bVar4 = (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_finish !=
          (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_start;
  if (bVar4) {
    cursor = (Sequence *)dependents;
  }
  local_38 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
             ::_M_invoke;
  if (!bVar4) {
    local_38 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
               ::_M_invoke;
  }
  local_40 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
             ::_M_manager;
  if (!bVar4) {
    local_40 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
               ::_M_manager;
  }
  local_48 = 0;
  local_50 = cursor;
  do {
    lVar3 = (*local_38)(&local_50);
    if (*sequence <= lVar3) goto LAB_00124901;
    if (((alerted->_M_base)._M_i & 1U) != 0) goto LAB_001248f1;
    lVar3 = std::chrono::_V2::system_clock::now();
    if (lVar1 * 1000 + lVar2 <= lVar3) {
      lVar3 = -3;
      goto LAB_00124901;
    }
  } while (local_40 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_001248f1:
  lVar3 = -2;
LAB_00124901:
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return lVar3;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<R, P>& timeout) {
    int64_t available_sequence = kInitialCursorValue;

    const auto start = std::chrono::system_clock::now();
    const auto stop = start + timeout;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      if (stop <= std::chrono::system_clock::now()) return kTimeoutSignal;

      SpinPause();
    }

    return available_sequence;
  }